

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O0

char * host_ca_save(host_ca *hca)

{
  int iVar1;
  int iVar2;
  char *__filename;
  FILE *__stream;
  ptrlen pVar3;
  host_ca *local_58;
  char *err;
  _Bool bad;
  FILE *fp;
  char *filename;
  host_ca *hca_local;
  
  if (*hca->name == '\0') {
    hca_local = (host_ca *)dupstr("CA record must have a name");
  }
  else {
    __filename = make_filename(7,hca->name);
    __stream = fopen(__filename,"w");
    if (__stream == (FILE *)0x0) {
      hca_local = (host_ca *)dupprintf("Unable to open file \'%s\'",__filename);
    }
    else {
      fprintf(__stream,"PublicKey=");
      pVar3 = ptrlen_from_strbuf(hca->ca_public_key);
      base64_encode_fp((FILE *)__stream,pVar3,0);
      fprintf(__stream,"\n");
      fprintf(__stream,"Validity=");
      pVar3 = ptrlen_from_asciz(hca->validity_expression);
      percent_encode_fp((FILE *)__stream,pVar3,(char *)0x0);
      fprintf(__stream,"\n");
      fprintf(__stream,"PermitRSASHA1=%d\n",(ulong)((hca->opts).permit_rsa_sha1 & 1));
      fprintf(__stream,"PermitRSASHA256=%d\n",(ulong)((hca->opts).permit_rsa_sha256 & 1));
      fprintf(__stream,"PermitRSASHA512=%d\n",(ulong)((hca->opts).permit_rsa_sha512 & 1));
      iVar1 = ferror(__stream);
      iVar2 = fclose(__stream);
      local_58 = (host_ca *)0x0;
      if (iVar2 < 0 || iVar1 != 0) {
        local_58 = (host_ca *)dupprintf("Unable to write file \'%s\'",__filename);
      }
      safefree(__filename);
      hca_local = local_58;
    }
  }
  return (char *)hca_local;
}

Assistant:

char *host_ca_save(host_ca *hca)
{
    if (!*hca->name)
        return dupstr("CA record must have a name");

    char *filename = make_filename(INDEX_HOSTCA, hca->name);
    FILE *fp = fopen(filename, "w");
    if (!fp)
        return dupprintf("Unable to open file '%s'", filename);

    fprintf(fp, "PublicKey=");
    base64_encode_fp(fp, ptrlen_from_strbuf(hca->ca_public_key), 0);
    fprintf(fp, "\n");

    fprintf(fp, "Validity=");
    percent_encode_fp(fp, ptrlen_from_asciz(hca->validity_expression), NULL);
    fprintf(fp, "\n");

    fprintf(fp, "PermitRSASHA1=%d\n", (int)hca->opts.permit_rsa_sha1);
    fprintf(fp, "PermitRSASHA256=%d\n", (int)hca->opts.permit_rsa_sha256);
    fprintf(fp, "PermitRSASHA512=%d\n", (int)hca->opts.permit_rsa_sha512);

    bool bad = ferror(fp);
    if (fclose(fp) < 0)
        bad = true;

    char *err = NULL;
    if (bad)
        err = dupprintf("Unable to write file '%s'", filename);

    sfree(filename);
    return err;
}